

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O2

int decode_one_follow(MMDB_s *mmdb,uint32_t offset,MMDB_entry_data_s *entry_data)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = decode_one(mmdb,offset,entry_data);
  if (iVar3 == 0) {
    iVar4 = 0;
    iVar3 = 0;
    if (entry_data->type == 1) {
      uVar1 = entry_data->offset_to_next;
      iVar3 = decode_one(mmdb,(entry_data->field_1).pointer,entry_data);
      if (iVar3 == 0) {
        uVar2 = entry_data->type;
        if (uVar2 == 1) {
          iVar3 = 7;
        }
        else {
          iVar3 = iVar4;
          if ((uVar2 != 7) && (uVar2 != 0xb)) {
            entry_data->offset_to_next = uVar1;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int decode_one_follow(const MMDB_s *const mmdb,
                             uint32_t offset,
                             MMDB_entry_data_s *entry_data) {
    CHECKED_DECODE_ONE(mmdb, offset, entry_data);
    if (entry_data->type == MMDB_DATA_TYPE_POINTER) {
        uint32_t next = entry_data->offset_to_next;
        CHECKED_DECODE_ONE(mmdb, entry_data->pointer, entry_data);
        /* Pointers to pointers are illegal under the spec */
        if (entry_data->type == MMDB_DATA_TYPE_POINTER) {
            DEBUG_MSG("pointer points to another pointer");
            return MMDB_INVALID_DATA_ERROR;
        }

        /* The pointer could point to any part of the data section but the
         * next entry for this particular offset may be the one after the
         * pointer, not the one after whatever the pointer points to. This
         * depends on whether the pointer points to something that is a simple
         * value or a compound value. For a compound value, the next one is
         * the one after the pointer result, not the one after the pointer. */
        if (entry_data->type != MMDB_DATA_TYPE_MAP &&
            entry_data->type != MMDB_DATA_TYPE_ARRAY) {

            entry_data->offset_to_next = next;
        }
    }

    return MMDB_SUCCESS;
}